

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::anon_unknown_0::PreservingSwapTest::iterate(PreservingSwapTest *this)

{
  TestLog *log;
  bool bVar1;
  EGLint width;
  EGLint height;
  deUint32 dVar2;
  int y;
  Library *egl;
  DrawType extraout_EDX;
  DrawType drawType;
  DrawType extraout_EDX_00;
  DrawType drawType_00;
  DrawType drawType_01;
  char *description;
  qpTestResult testResult;
  int x;
  int py;
  int px;
  float red;
  float green;
  float blue;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float alpha;
  Surface postSwapFramebufferReference;
  Surface preSwapFramebuffer;
  Surface postSwapFramebuffer;
  Surface preSwapFramebufferReference;
  RGBA local_44;
  Random rnd;
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  deRandom_init(&rnd.m_rnd,this->m_seed);
  width = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3057);
  height = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3056);
  red = deRandom_getFloat(&rnd.m_rnd);
  green = deRandom_getFloat(&rnd.m_rnd);
  blue = deRandom_getFloat(&rnd.m_rnd);
  fVar3 = deRandom_getFloat(&rnd.m_rnd);
  fVar4 = deRandom_getFloat(&rnd.m_rnd);
  fVar5 = deRandom_getFloat(&rnd.m_rnd);
  fVar6 = deRandom_getFloat(&rnd.m_rnd);
  fVar7 = deRandom_getFloat(&rnd.m_rnd);
  fVar8 = deRandom_getFloat(&rnd.m_rnd);
  fVar9 = deRandom_getFloat(&rnd.m_rnd);
  fVar10 = deRandom_getFloat(&rnd.m_rnd);
  tcu::Surface::Surface(&postSwapFramebufferReference,width,height);
  tcu::Surface::Surface(&preSwapFramebufferReference,width,height);
  tcu::Surface::Surface(&postSwapFramebuffer,width,height);
  tcu::Surface::Surface(&preSwapFramebuffer,width,height);
  if (this->m_preserveColorbuffer == true) {
    (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3094);
    dVar2 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar2,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                     ,0x1c1);
  }
  (*egl->_vptr_Library[0x27])
            (egl,this->m_eglDisplay,this->m_eglSurface,this->m_eglSurface,this->m_eglContext);
  dVar2 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar2,"makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                   ,0x1c3);
  alpha = 1.0;
  (*(this->m_gl).clearColor)(red,green,blue,1.0);
  (*(this->m_gl).clear)(0x4000);
  if (this->m_readPixelsBeforeSwap == true) {
    clearColorReference(&preSwapFramebufferReference,red,green,blue,alpha);
  }
  clearColorReference(&postSwapFramebufferReference,red,green,blue,alpha);
  fVar3 = fVar3 * -0.9;
  fVar4 = fVar4 * -0.9;
  fVar5 = fVar5 * 0.9;
  fVar6 = fVar6 * 0.9;
  drawType_00 = extraout_EDX;
  if (this->m_preSwapDrawType != DRAWTYPE_NONE) {
    GLES2Program::render
              (this->m_gles2Program,width,height,fVar3,fVar4,fVar5,fVar6,this->m_preSwapDrawType);
    ReferenceProgram::render
              ((ReferenceProgram *)&postSwapFramebufferReference,
               (Surface *)(ulong)this->m_preSwapDrawType,fVar3,fVar4,fVar5,fVar6,drawType);
    drawType_00 = extraout_EDX_00;
  }
  if (this->m_readPixelsBeforeSwap == true) {
    if (this->m_preSwapDrawType != DRAWTYPE_NONE) {
      ReferenceProgram::render
                ((ReferenceProgram *)&preSwapFramebufferReference,
                 (Surface *)(ulong)this->m_preSwapDrawType,fVar3,fVar4,fVar5,fVar6,drawType_00);
    }
    anon_unknown_0::readPixels(&this->m_gl,&preSwapFramebuffer);
  }
  (*egl->_vptr_Library[0x31])(egl,this->m_eglDisplay,this->m_eglSurface);
  dVar2 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar2,"swapBuffers(m_eglDisplay, m_eglSurface)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                   ,0x1da);
  fVar7 = fVar7 * -0.9;
  fVar8 = fVar8 * -0.9;
  fVar9 = fVar9 * 0.9;
  fVar10 = fVar10 * 0.9;
  if (this->m_postSwapDrawType != DRAWTYPE_NONE) {
    ReferenceProgram::render
              ((ReferenceProgram *)&postSwapFramebufferReference,
               (Surface *)(ulong)this->m_postSwapDrawType,fVar7,fVar8,fVar9,fVar10,drawType_01);
    GLES2Program::render
              (this->m_gles2Program,width,height,fVar7,fVar8,fVar9,fVar10,this->m_postSwapDrawType);
  }
  anon_unknown_0::readPixels(&this->m_gl,&postSwapFramebuffer);
  if (this->m_preserveColorbuffer == true) {
    if (this->m_readPixelsBeforeSwap == true) {
      bVar1 = compareToReference(log,"Compare pre-swap framebuffer to reference",
                                 "Compare pre-swap framebuffer to reference",
                                 &preSwapFramebufferReference,&preSwapFramebuffer,0,0,width,height);
      if (bVar1) goto LAB_00e3d0e4;
      bVar1 = false;
    }
    else {
LAB_00e3d0e4:
      bVar1 = compareToReference(log,"Compare post-swap framebuffer to reference",
                                 "Compare post-swap framebuffer to reference",
                                 &postSwapFramebufferReference,&postSwapFramebuffer,0,0,width,height
                                );
    }
    if ((this->m_readPixelsBeforeSwap == true) && (this->m_postSwapDrawType == DRAWTYPE_NONE)) {
      if (bVar1 == false) goto LAB_00e3d26a;
      local_44.m_value = 0;
      bVar1 = tcu::pixelThresholdCompare
                        (log,"Pre- / Post framebuffer compare",
                         "Compare pre- and post-swap framebuffers",&preSwapFramebuffer,
                         &postSwapFramebuffer,&local_44,COMPARE_LOG_RESULT);
    }
LAB_00e3d25b:
    if (bVar1 != false) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00e3d276;
    }
  }
  else {
    if (this->m_readPixelsBeforeSwap != true) {
LAB_00e3d154:
      x = (int)(fVar7 * (float)width * 0.5 + (float)(width / 2));
      y = (int)(fVar8 * (float)height * 0.5 + (float)(height / 2));
      bVar1 = compareToReference(log,"Compare valid are of post-swap framebuffer to reference",
                                 "Compare valid area of post-swap framebuffer to reference",
                                 &postSwapFramebufferReference,&postSwapFramebuffer,x,y,
                                 (int)((float)width * 0.5 * fVar9 + (float)(width / 2)) - x,
                                 (int)((float)height * 0.5 * fVar10 + (float)(height / 2)) - y);
      goto LAB_00e3d25b;
    }
    bVar1 = compareToReference(log,"Compare pre-swap framebuffer to reference",
                               "Compare pre-swap framebuffer to reference",
                               &preSwapFramebufferReference,&preSwapFramebuffer,0,0,width,height);
    if (bVar1) goto LAB_00e3d154;
  }
LAB_00e3d26a:
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00e3d276:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  tcu::Surface::~Surface(&preSwapFramebuffer);
  tcu::Surface::~Surface(&postSwapFramebuffer);
  tcu::Surface::~Surface(&preSwapFramebufferReference);
  tcu::Surface::~Surface(&postSwapFramebufferReference);
  return STOP;
}

Assistant:

TestCase::IterateResult PreservingSwapTest::iterate (void)
{
	const Library&	egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log				= m_testCtx.getLog();
	de::Random		rnd(m_seed);

	const int		width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int		height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);

	const float		clearRed		= rnd.getFloat();
	const float		clearGreen		= rnd.getFloat();
	const float		clearBlue		= rnd.getFloat();
	const float		clearAlpha		= 1.0f;

	const float		preSwapX1		= -0.9f * rnd.getFloat();
	const float		preSwapY1		= -0.9f * rnd.getFloat();
	const float		preSwapX2		= 0.9f * rnd.getFloat();
	const float		preSwapY2		= 0.9f * rnd.getFloat();

	const float		postSwapX1		= -0.9f * rnd.getFloat();
	const float		postSwapY1		= -0.9f * rnd.getFloat();
	const float		postSwapX2		= 0.9f * rnd.getFloat();
	const float		postSwapY2		= 0.9f * rnd.getFloat();

	tcu::Surface	postSwapFramebufferReference(width, height);
	tcu::Surface	preSwapFramebufferReference(width, height);

	tcu::Surface	postSwapFramebuffer(width, height);
	tcu::Surface	preSwapFramebuffer(width, height);

	if (m_preserveColorbuffer)
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));

	EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext));

	clearColorScreen(m_gl, clearRed, clearGreen, clearBlue, clearAlpha);

	if (m_readPixelsBeforeSwap)
		clearColorReference(&preSwapFramebufferReference, clearRed, clearGreen, clearBlue, clearAlpha);

	clearColorReference(&postSwapFramebufferReference, clearRed, clearGreen, clearBlue, clearAlpha);

	if (m_preSwapDrawType != DRAWTYPE_NONE)
	{
		m_gles2Program->render(width, height, preSwapX1, preSwapY1, preSwapX2, preSwapY2, m_preSwapDrawType);
		m_refProgram->render(&postSwapFramebufferReference, preSwapX1, preSwapY1, preSwapX2, preSwapY2, m_preSwapDrawType);
	}

	if (m_readPixelsBeforeSwap)
	{
		if (m_preSwapDrawType != DRAWTYPE_NONE)
			m_refProgram->render(&preSwapFramebufferReference, preSwapX1, preSwapY1, preSwapX2, preSwapY2, m_preSwapDrawType);

		readPixels(m_gl, &preSwapFramebuffer);
	}

	EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));

	if (m_postSwapDrawType != DRAWTYPE_NONE)
	{
		m_refProgram->render(&postSwapFramebufferReference, postSwapX1, postSwapY1, postSwapX2, postSwapY2, m_postSwapDrawType);
		m_gles2Program->render(width, height, postSwapX1, postSwapY1, postSwapX2, postSwapY2, m_postSwapDrawType);
	}

	readPixels(m_gl, &postSwapFramebuffer);

	bool isOk = true;

	if (m_preserveColorbuffer)
	{
		if (m_readPixelsBeforeSwap)
			isOk = isOk && compareToReference(log, "Compare pre-swap framebuffer to reference", "Compare pre-swap framebuffer to reference", preSwapFramebufferReference, preSwapFramebuffer, 0, 0, width, height);

		isOk = isOk && compareToReference(log, "Compare post-swap framebuffer to reference", "Compare post-swap framebuffer to reference", postSwapFramebufferReference, postSwapFramebuffer, 0, 0, width, height);

		if (m_readPixelsBeforeSwap && m_postSwapDrawType == PreservingSwapTest::DRAWTYPE_NONE)
			isOk = isOk && comparePreAndPostSwapFramebuffers(log, preSwapFramebuffer, postSwapFramebuffer);
	}
	else
	{
		const int ox	= width/2;
		const int oy	= height/2;

		const int px	= width;
		const int py	= height;

		const int x1i	= (int)(((float)px/2.0f) * postSwapX1 + (float)ox);
		const int y1i	= (int)(((float)py/2.0f) * postSwapY1 + (float)oy);

		const int x2i	= (int)(((float)px/2.0f) * postSwapX2 + (float)ox);
		const int y2i	= (int)(((float)py/2.0f) * postSwapY2 + (float)oy);

		if (m_readPixelsBeforeSwap)
			isOk = isOk && compareToReference(log, "Compare pre-swap framebuffer to reference", "Compare pre-swap framebuffer to reference", preSwapFramebufferReference, preSwapFramebuffer, 0, 0, width, height);

		DE_ASSERT(m_postSwapDrawType != DRAWTYPE_NONE);
		isOk = isOk && compareToReference(log, "Compare valid are of post-swap framebuffer to reference", "Compare valid area of post-swap framebuffer to reference", postSwapFramebufferReference, postSwapFramebuffer, x1i, y1i, x2i - x1i, y2i - y1i);
	}

	if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}